

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.c
# Opt level: O0

void * ticket_file_updater(void *unused)

{
  int iVar1;
  int *piVar2;
  char local_1a8 [8];
  char errbuf [256];
  stat st;
  time_t last_mtime;
  void *unused_local;
  
  st.__glibc_reserved[2] = 1;
  do {
    iVar1 = stat((char *)conf.ticket.vars.generating.cipher,(stat *)(errbuf + 0xf8));
    if (iVar1 == 0) {
      if (st.__glibc_reserved[2] != st.st_atim.tv_nsec) {
        st.__glibc_reserved[2] = st.st_atim.tv_nsec;
        iVar1 = load_tickets_file((char *)conf.ticket.vars.generating.cipher);
        if (iVar1 == 0) {
          fprintf(_stderr,"session ticket secrets have been (re)loaded\n");
        }
      }
    }
    else {
      if (st.__glibc_reserved[2] != 0) {
        piVar2 = __errno_location();
        strerror_r(*piVar2,local_1a8,0x100);
        fprintf(_stderr,"cannot load session ticket secrets from file:%s:%s\n",
                conf.ticket.vars.generating.cipher,local_1a8);
      }
      st.__glibc_reserved[2] = 0;
    }
    sleep(10);
  } while( true );
}

Assistant:

H2O_NORETURN static void *ticket_file_updater(void *unused)
{
    time_t last_mtime = 1; /* file is loaded if mtime changes, 0 is used to indicate that the file was missing */

    while (1) {
        struct stat st;
        if (stat(conf.ticket.vars.file.filename, &st) != 0) {
            if (last_mtime != 0) {
                char errbuf[256];
                strerror_r(errno, errbuf, sizeof(errbuf));
                fprintf(stderr, "cannot load session ticket secrets from file:%s:%s\n", conf.ticket.vars.file.filename, errbuf);
            }
            last_mtime = 0;
        } else if (last_mtime != st.st_mtime) {
            /* (re)load */
            last_mtime = st.st_mtime;
            if (load_tickets_file(conf.ticket.vars.file.filename) == 0)
                fprintf(stderr, "session ticket secrets have been (re)loaded\n");
        }
        sleep(10);
    }
}